

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
hta::detail::make_exception<const_char_*>::operator()
          (make_exception<const_char_*> *this,stringstream *msg,char *arg)

{
  size_t sVar1;
  ostream *poVar2;
  
  poVar2 = (ostream *)(msg + 0x10);
  if (arg != (char *)0x0) {
    sVar1 = strlen(arg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,arg,sVar1);
    return;
  }
  std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg)
        {
            msg << arg;
        }